

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Kernel::TermList> Lib::VirtualIterator<Kernel::TermList>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Kernel::TermList> *core;
  IteratorCore<Kernel::TermList> *in_RDI;
  
  if (getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Kernel::TermList> *)
             EmptyIterator<Kernel::TermList>::operator_new(0x78d36a);
      EmptyIterator<Kernel::TermList>::EmptyIterator((EmptyIterator<Kernel::TermList> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Kernel::TermList> *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<Kernel::TermList>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }